

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_buffer.h
# Opt level: O2

void __thiscall lumeview::GLBuffer::set_sub_data(GLBuffer *this,uint offset,void *data,uint size)

{
  LumeviewError *this_00;
  string local_1d0;
  stringstream ss;
  ostream local_1a0 [376];
  
  if (size + offset <= this->m_size) {
    (*glad_glBindBuffer)(this->m_type,this->m_id);
    (*glad_glBufferSubData)(this->m_type,(GLintptr)offset,(GLsizeiptr)size,data);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::operator<<(local_1a0,
                  "GLBuffer::set_sub_data: Specified buffer region expands over buffer boundary");
  this_00 = (LumeviewError *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  LumeviewError::LumeviewError(this_00,&local_1d0);
  __cxa_throw(this_00,&LumeviewError::typeinfo,LumeviewError::~LumeviewError);
}

Assistant:

void set_sub_data (const uint offset, const void* data, const uint size) {
		COND_THROW (offset + size > m_size,
		            "GLBuffer::set_sub_data: Specified buffer region expands over buffer boundary");
		bind ();
		glBufferSubData (m_type, offset, size, data);
	}